

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void vkt::anon_unknown_0::queueSubmit
               (DeviceInterface *vk,VkQueue queue,deUint32 cmdBufferCount,
               VkCommandBuffer *pCmdBuffers,VkFence fence)

{
  VkResult result;
  undefined4 local_78 [2];
  VkSubmitInfo submitInfo;
  VkCommandBuffer *pCmdBuffers_local;
  deUint32 cmdBufferCount_local;
  VkQueue queue_local;
  DeviceInterface *vk_local;
  VkFence fence_local;
  
  submitInfo.pSignalSemaphores = (VkSemaphore *)pCmdBuffers;
  memset(local_78,0,0x48);
  local_78[0] = 4;
  submitInfo._40_8_ = submitInfo.pSignalSemaphores;
  submitInfo.pWaitDstStageMask._0_4_ = cmdBufferCount;
  result = (*vk->_vptr_DeviceInterface[2])(vk,queue,1,local_78,fence.m_internal);
  ::vk::checkResult(result,"vk.queueSubmit(queue, 1u, &submitInfo, fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktRenderPassTests.cpp"
                    ,0x159);
  return;
}

Assistant:

void queueSubmit (const DeviceInterface& vk, VkQueue queue, deUint32 cmdBufferCount, const VkCommandBuffer* pCmdBuffers, VkFence fence)
{
	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0u,								// waitSemaphoreCount
		(const VkSemaphore*)DE_NULL,	// pWaitSemaphores
		(const VkPipelineStageFlags*)DE_NULL,
		cmdBufferCount,					// commandBufferCount
		pCmdBuffers,
		0u,								// signalSemaphoreCount
		(const VkSemaphore*)DE_NULL,	// pSignalSemaphores
	};
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, fence));
}